

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall
PatternModel::setCursorColumnImpl(PatternModel *this,int column,CursorChangeFlags *flags)

{
  int iVar1;
  
  if ((this->mCursor).super_PatternCursorBase.column == column) {
    return;
  }
  if (column < 0) {
    setCursorTrackImpl(this,(this->mCursor).super_PatternCursorBase.track + -1,flags);
    if ((flags->i & 4) != 0) {
LAB_0016c995:
      column = (this->mMaxColumns)._M_elems[(this->mCursor).super_PatternCursorBase.track] + -1;
      goto LAB_0016c9a3;
    }
  }
  else {
    iVar1 = (this->mCursor).super_PatternCursorBase.track;
    if (column < (this->mMaxColumns)._M_elems[iVar1]) goto LAB_0016c9a3;
    setCursorTrackImpl(this,iVar1 + 1,flags);
    if ((flags->i & 4) == 0) goto LAB_0016c995;
  }
  column = 0;
LAB_0016c9a3:
  if ((this->mCursor).super_PatternCursorBase.column != column) {
    (this->mCursor).super_PatternCursorBase.column = column;
    *(byte *)&flags->i = (byte)flags->i | 2;
  }
  return;
}

Assistant:

void PatternModel::setCursorColumnImpl(int column, CursorChangeFlags &flags) {
    if (column == mCursor.column) {
        return;
    }

    if (column < 0) {
        auto track = mCursor.track - 1;
        setCursorTrackImpl(track, flags);
        if (flags & CursorTrackChanged) {
            column = mMaxColumns[mCursor.track] - 1;
        } else {
            column = 0;
        }
    } else if (column >= mMaxColumns[mCursor.track]) {
        setCursorTrackImpl(mCursor.track + 1, flags);
        if (flags & CursorTrackChanged) {
            column = 0;
        } else {
            column = mMaxColumns[mCursor.track] - 1;
        }
    }

    if (mCursor.column != column) {
        mCursor.column = column;
        flags |= CursorColumnChanged;
    }

}